

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall imrt::Station::generate_random_intensities(Station *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  long in_RDI;
  int right;
  int left;
  int j;
  pair<int,_int> aux;
  list<int,_std::allocator<int>_> in_1;
  int i_1;
  int in;
  int i;
  vector<int,_std::allocator<int>_> values;
  list<int,_std::allocator<int>_> *in_stack_00000620;
  Collimator *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  pair<int,_int> in_stack_ffffffffffffff60;
  pair<int,_int> this_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_70;
  int local_6c;
  int local_68;
  int local_60;
  int iStack_5c;
  list<int,_std::allocator<int>_> local_58;
  int local_40;
  int local_3c;
  int iVar5;
  undefined4 in_stack_ffffffffffffffcc;
  double in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  Station *in_stack_ffffffffffffffe0;
  
  clearIntensity((Station *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::allocator<int>::allocator((allocator<int> *)0x141fe4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (allocator_type *)in_stack_ffffffffffffff60);
  std::allocator<int>::~allocator((allocator<int> *)0x14200a);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffe0,0);
  *pvVar4 = 0;
  for (iVar5 = 1; iVar5 < *(int *)(in_RDI + 0x40) + 1; iVar5 = iVar5 + 1) {
    iVar2 = rand();
    iVar2 = (int)((double)(iVar2 % (*(int *)(in_RDI + 0x44) + 1)) / 2.0);
    local_3c = iVar2;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffe0,(long)iVar5);
    *pvVar4 = iVar2;
  }
  local_40 = 0;
  while (iVar2 = local_40, iVar3 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0)),
        iVar2 < iVar3) {
    std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x14210e)
    ;
    in_stack_ffffffffffffff60 = Collimator::getActiveRange(in_stack_ffffffffffffff48,0,0x142126);
    local_60 = in_stack_ffffffffffffff60.first;
    if (-1 < local_60) {
      this_00 = in_stack_ffffffffffffff60;
      for (local_68 = local_60; iStack_5c = in_stack_ffffffffffffff60.second, local_68 <= iStack_5c;
          local_68 = local_68 + 1) {
        iVar2 = rand();
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffe0,
                   (long)(iVar2 % (*(int *)(in_RDI + 0x40) + 1)));
        std::__cxx11::list<int,_std::allocator<int>_>::push_back
                  ((list<int,_std::allocator<int>_> *)this_00,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      std::__cxx11::list<int,_std::allocator<int>_>::sort(in_stack_00000620);
      local_6c = local_60;
      local_70 = iStack_5c;
      while (bVar1 = std::__cxx11::list<int,_std::allocator<int>_>::empty(&local_58),
            in_stack_ffffffffffffff60 = this_00, ((bVar1 ^ 0xffU) & 1) != 0) {
        iVar2 = rand();
        if (iVar2 % 2 == 0) {
          iVar2 = local_70 + -1;
          in_stack_ffffffffffffff50 = local_40;
          std::__cxx11::list<int,_std::allocator<int>_>::front
                    ((list<int,_std::allocator<int>_> *)CONCAT44(local_70,local_40));
          change_intensity(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                           in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )CONCAT44(in_stack_ffffffffffffffcc,iVar5));
          in_stack_ffffffffffffff54 = local_70;
          local_70 = iVar2;
        }
        else {
          iVar2 = local_6c + 1;
          in_stack_ffffffffffffff58 = local_40;
          std::__cxx11::list<int,_std::allocator<int>_>::front
                    ((list<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          change_intensity(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                           in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )CONCAT44(in_stack_ffffffffffffffcc,iVar5));
          in_stack_ffffffffffffff5c = local_6c;
          local_6c = iVar2;
        }
        std::__cxx11::list<int,_std::allocator<int>_>::pop_front
                  ((list<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
    }
    std::__cxx11::list<int,_std::allocator<int>_>::~list
              ((list<int,_std::allocator<int>_> *)0x1422b9);
    local_40 = local_40 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60);
  return;
}

Assistant:

void Station::generate_random_intensities(){
    clearIntensity();

    vector<int> values(max_apertures+1);
    values[0] = 0;
    for(int i=1; i<max_apertures+1;i++){
      int in=rand()%(max_intensity+1)/2.0;
      values[i]=in;
    }

    for (int i=0; i < collimator.getXdim(); i++) {
      list<int> in;
      pair <int,int> aux = collimator.getActiveRange(i,angle);
      if(aux.first<0) continue;

      for (int j=aux.first; j<=aux.second; j++)
        in.push_back(values[rand()%(max_apertures+1)]);
      in.sort();

      int left=aux.first,right=aux.second;
      while(!in.empty()){
        if(rand()%2)
          change_intensity(i, left++, in.front());
        else
          change_intensity(i, right--, in.front());
        in.pop_front();
      }
    }
  //  printIntensity();
  }